

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

PassToken spvtools::CreateWorkaround1209Pass(void)

{
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  in_RDI;
  unique_ptr<spvtools::opt::Workaround1209,_std::default_delete<spvtools::opt::Workaround1209>_>
  local_20;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_18 [2];
  
  MakeUnique<spvtools::opt::Workaround1209>();
  MakeUnique<spvtools::Optimizer::PassToken::Impl,std::unique_ptr<spvtools::opt::Workaround1209,std::default_delete<spvtools::opt::Workaround1209>>>
            ((spvtools *)local_18,&local_20);
  Optimizer::PassToken::PassToken
            ((PassToken *)
             in_RDI._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl,
             local_18);
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr(local_18);
  std::
  unique_ptr<spvtools::opt::Workaround1209,_std::default_delete<spvtools::opt::Workaround1209>_>::
  ~unique_ptr(&local_20);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
}

Assistant:

Optimizer::PassToken CreateWorkaround1209Pass() {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::Workaround1209>());
}